

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O1

bool __thiscall QRhiWidget::event(QRhiWidget *this,QEvent *e)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QRhiWidgetPrivate *this_00;
  QRhi *pQVar5;
  QWidgetData *pQVar6;
  bool bVar7;
  long in_FS_OFFSET;
  QRect local_40;
  QRegion local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QRhiWidgetPrivate **)&(this->super_QWidget).field_0x8;
  if (*(short *)(e + 8) == 0x11) {
    pQVar6 = (this->super_QWidget).data;
    if ((pQVar6->widget_attributes & 0x8000) != 0) {
      local_40.x1.m_i = 0;
      local_40.y1.m_i = 0;
      uVar1 = (pQVar6->crect).x2;
      uVar3 = (pQVar6->crect).y2;
      uVar2 = (pQVar6->crect).x1;
      uVar4 = (pQVar6->crect).y1;
      local_40.x2.m_i = uVar1 - uVar2;
      local_40.y2.m_i = uVar3 - uVar4;
      QRegion::QRegion(&local_30,&local_40,Rectangle);
      QWidgetPrivate::sendPaintEvent(&this_00->super_QWidgetPrivate,&local_30);
      QRegion::~QRegion(&local_30);
    }
  }
  else if (*(short *)(e + 8) == 0xdd) {
    this_00->textureInvalid = true;
    pQVar5 = this_00->rhi;
    if ((pQVar5 != (QRhi *)0x0) && (pQVar5 != (this_00->offscreenRenderer).m_rhi)) {
      QRhi::removeCleanupCallback(pQVar5);
      (**(code **)(*(long *)&this->super_QWidget + 0x1b0))(this);
      QRhiWidgetPrivate::releaseResources(this_00);
    }
  }
  bVar7 = QWidget::event(&this->super_QWidget,e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QRhiWidget::event(QEvent *e)
{
    Q_D(QRhiWidget);
    switch (e->type()) {
    case QEvent::WindowAboutToChangeInternal:
        // The QRhi will almost certainly change, prevent texture() from
        // returning the existing QRhiTexture in the meantime.
        d->textureInvalid = true;

        if (d->rhi && d->rhi != d->offscreenRenderer.rhi()) {
            // Drop the cleanup callback registered to the toplevel's rhi and
            // do the early-release, there may not be another chance to do
            // this, and the QRhi we have currently set may be destroyed by the
            // time we get to ensureRhi() again.
            d->rhi->removeCleanupCallback(this);
            releaseResources(); // notify the user code about the early-release
            d->releaseResources();
            // must _not_ null out d->rhi here, for proper interaction with ensureRhi()
        }

        break;

    case QEvent::Show:
        if (isVisible())
            d->sendPaintEvent(QRect(QPoint(0, 0), size()));
        break;
    default:
        break;
    }
    return QWidget::event(e);
}